

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

void js_std_dump_error1(JSContext *ctx,JSValue exception_val)

{
  int iVar1;
  JSValue val;
  
  iVar1 = JS_IsError(ctx,exception_val);
  js_dump_obj(ctx,_stderr,exception_val);
  if (iVar1 != 0) {
    val = JS_GetPropertyStr(ctx,exception_val,"stack");
    if ((uint)val.tag != 3) {
      js_dump_obj(ctx,_stderr,val);
    }
    if ((0xfffffff4 < (uint)val.tag) &&
       (iVar1 = *val.u.ptr, *(int *)val.u.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValue(ctx,val);
    }
  }
  return;
}

Assistant:

static void js_std_dump_error1(JSContext *ctx, JSValueConst exception_val)
{
    JSValue val;
    BOOL is_error;
    
    is_error = JS_IsError(ctx, exception_val);
    js_dump_obj(ctx, stderr, exception_val);
    if (is_error) {
        val = JS_GetPropertyStr(ctx, exception_val, "stack");
        if (!JS_IsUndefined(val)) {
            js_dump_obj(ctx, stderr, val);
        }
        JS_FreeValue(ctx, val);
    }
}